

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O3

string * AppendPID(string *__return_storage_ptr__,string *str)

{
  size_type *psVar1;
  size_type *psVar2;
  uint __val;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  pointer pcVar9;
  uint __len;
  size_type *local_70;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  __str_1.field_2._8_8_ = &__str._M_string_length;
  pcVar9 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(__str_1.field_2._M_local_buf + 8),pcVar9,pcVar9 + str->_M_string_length);
  std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
  uVar5 = getpid();
  __val = -uVar5;
  if (0 < (int)uVar5) {
    __val = uVar5;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00108e28;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00108e28;
      }
      if (uVar7 < 10000) goto LAB_00108e28;
      uVar8 = uVar8 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00108e28:
  psVar1 = &__str_1._M_string_length;
  local_70 = psVar1;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar5 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_70),__len,__val);
  pcVar9 = (pointer)0xf;
  if ((size_type *)__str_1.field_2._8_8_ != &__str._M_string_length) {
    pcVar9 = (pointer)__str._M_string_length;
  }
  if (pcVar9 < __str_1._M_dataplus._M_p + __str._M_dataplus._M_p) {
    pcVar9 = (pointer)0xf;
    if (local_70 != psVar1) {
      pcVar9 = (pointer)__str_1._M_string_length;
    }
    if (__str_1._M_dataplus._M_p + __str._M_dataplus._M_p <= pcVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,__str_1.field_2._8_8_);
      goto LAB_00108eae;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append(__str_1.field_2._M_local_buf + 8,(ulong)local_70);
LAB_00108eae:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar2) {
    uVar3 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar2;
  puVar6[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_70 != psVar1) {
    operator_delete(local_70,__str_1._M_string_length + 1);
  }
  if ((size_type *)__str_1.field_2._8_8_ != &__str._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_,__str._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AppendPID(const std::string &str) {
  return str + "_" + std::to_string(getpid());
}